

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O3

bool __thiscall
math::wide_integer::uintwide_t<48u,unsigned_short,void,false>::wr_string<char*>
          (uintwide_t<48u,unsigned_short,void,false> *this,char *str_result,uint_fast8_t base_rep,
          bool show_base,bool show_pos,bool is_uppercase,unsigned_fast_type field_width,
          char fill_char_str)

{
  short *psVar1;
  byte bVar2;
  ushort uVar3;
  long lVar4;
  unsigned_fast_type uVar5;
  ulong uVar6;
  ulong uVar7;
  ushort uVar8;
  int iVar9;
  undefined7 in_register_00000011;
  uint uVar10;
  uint uVar11;
  bool bVar12;
  uintwide_t<24U,_unsigned_char,_void,_false> t;
  uintwide_t<24U,_unsigned_char,_void,_false> tmp;
  undefined4 local_68;
  undefined2 local_64;
  undefined4 local_60;
  undefined2 local_5c;
  byte local_58 [24];
  undefined4 local_40;
  undefined2 local_3c;
  undefined4 local_38;
  undefined2 local_34;
  
  iVar9 = (int)CONCAT71(in_register_00000011,base_rep);
  if (iVar9 == 0x10) {
    local_64 = *(undefined2 *)(this + 4);
    local_68 = *(undefined4 *)this;
    local_58[0] = 0;
    local_58[1] = 0;
    local_58[2] = 0;
    local_58[3] = 0;
    local_58[4] = 0;
    local_58[5] = 0;
    local_58[6] = 0;
    local_58[7] = 0;
    local_58[8] = 0;
    local_58[9] = 0;
    local_58[10] = 0;
    local_58[0xb] = 0;
    local_58[0xc] = 0;
    local_58[0xd] = 0;
    local_58[0xe] = 0;
    local_58[0xf] = 0;
    local_58[0x10] = 0;
    local_58[0x11] = 0;
    local_58[0x12] = 0;
    local_58[0x13] = 0;
    lVar4 = 0;
    do {
      psVar1 = (short *)((long)&local_68 + lVar4);
      if (*psVar1 != 0) break;
      bVar12 = lVar4 != 4;
      lVar4 = lVar4 + 2;
    } while (bVar12);
    if (*psVar1 == 0) {
      local_58[0x12] = 0x30;
      uVar6 = 0x12;
    }
    else {
      uVar5 = uintwide_t<48U,_unsigned_short,_void,_false>::extract_hex_digits<false,_nullptr>
                        ((uintwide_t<24U,_unsigned_char,_void,_false> *)&local_68,
                         (char *)(local_58 + 0x13),is_uppercase);
      uVar6 = 0x13 - uVar5;
    }
    if ((show_base) && (1 < (long)uVar6)) {
      local_58[(int)uVar6 - 1] = !is_uppercase << 5 | 0x58;
      uVar6 = uVar6 - 2;
      local_58[uVar6 & 0xffffffff] = 0x30;
    }
    if ((show_pos) && (0 < (long)uVar6)) {
      uVar6 = uVar6 - 1;
      local_58[uVar6 & 0xffffffff] = 0x2b;
    }
    if (field_width != 0) {
      lVar4 = 0;
      if (field_width < 0x14) {
        lVar4 = 0x13 - field_width;
      }
      while (lVar4 < (long)uVar6) {
        uVar6 = uVar6 - 1;
        local_58[uVar6 & 0xffffffff] = fill_char_str;
      }
    }
    local_58[0x13] = 0;
    lVar4 = 0;
    do {
      bVar2 = local_58[lVar4 + uVar6];
      str_result[lVar4] = bVar2;
      lVar4 = lVar4 + 1;
    } while (bVar2 != 0);
  }
  else if (iVar9 == 10) {
    local_5c = *(undefined2 *)(this + 4);
    local_60 = *(undefined4 *)this;
    local_58[0] = 0;
    local_58[1] = 0;
    local_58[2] = 0;
    local_58[3] = 0;
    local_58[4] = 0;
    local_58[5] = 0;
    local_58[6] = 0;
    local_58[7] = 0;
    local_58[8] = 0;
    local_58[9] = 0;
    local_58[10] = 0;
    local_58[0xb] = 0;
    local_58[0xc] = 0;
    local_58[0xd] = 0;
    local_58[0xe] = 0;
    local_58[0xf] = 0;
    local_58[0x10] = 0;
    local_58[0x11] = 0;
    local_58[0x12] = 0;
    local_58[0x13] = 0;
    local_58[0x14] = 0;
    local_58[0x15] = 0;
    local_58[0x16] = 0;
    lVar4 = 0;
    do {
      psVar1 = (short *)((long)&local_60 + lVar4);
      if (*psVar1 != 0) break;
      bVar12 = lVar4 != 4;
      lVar4 = lVar4 + 2;
    } while (bVar12);
    if (*psVar1 != 0) {
      uVar6 = 0x17;
      do {
        local_64 = local_5c;
        lVar4 = 0;
        do {
          psVar1 = (short *)((long)&local_60 + lVar4);
          if (*psVar1 != 0) break;
          bVar12 = lVar4 != 4;
          lVar4 = lVar4 + 2;
        } while (bVar12);
        if ((uVar6 == 0) || (*psVar1 == 0)) goto LAB_00147be9;
        local_34 = local_5c;
        local_38 = local_60;
        uVar11 = 0;
        lVar4 = 4;
        uVar10 = 0;
        do {
          uVar10 = (uVar11 * 0xfff6 + uVar10) * 0x10000 | (uint)*(ushort *)((long)&local_60 + lVar4)
          ;
          uVar11 = uVar10 / 10;
          *(short *)((long)&local_60 + lVar4) = (short)uVar11;
          lVar4 = lVar4 + -2;
        } while (lVar4 != -2);
        local_3c = local_5c;
        local_40 = local_60;
        lVar4 = 0;
        uVar11 = 0;
        do {
          uVar8 = *(ushort *)((long)&local_40 + lVar4 * 2);
          uVar11 = uVar11 + ((uint)uVar8 + (uint)uVar8 * 4) * 2;
          *(short *)((long)&local_40 + lVar4 * 2) = (short)uVar11;
          uVar11 = uVar11 >> 0x10;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 3);
        local_68 = local_60;
        lVar4 = 0;
        uVar11 = 0;
        do {
          uVar10 = (*(ushort *)((long)&local_68 + lVar4 * 2) - uVar11) -
                   (uint)*(ushort *)((long)&local_40 + lVar4 * 2);
          uVar11 = (uint)(0xffff < uVar10);
          *(short *)((long)&local_68 + lVar4 * 2) = (short)uVar10;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 3);
        local_58[uVar6 - 1 & 0xffffffff] = (byte)local_68 + 0x30;
        uVar6 = uVar6 - 1;
      } while( true );
    }
    local_58[0x16] = 0x30;
    uVar6 = 0x16;
LAB_00147be9:
    if (show_pos && 0 < (long)uVar6) {
      uVar6 = uVar6 - 1;
      local_58[uVar6 & 0xffffffff] = 0x2b;
    }
    if (field_width != 0) {
      lVar4 = 0;
      if (field_width < 0x18) {
        lVar4 = 0x17 - field_width;
      }
      while (lVar4 < (long)uVar6) {
        uVar6 = uVar6 - 1;
        local_58[uVar6 & 0xffffffff] = fill_char_str;
      }
    }
    local_58[0x17] = 0;
    lVar4 = 0;
    do {
      bVar2 = local_58[lVar4 + uVar6];
      str_result[lVar4] = bVar2;
      lVar4 = lVar4 + 1;
    } while (bVar2 != 0);
  }
  else {
    if (iVar9 != 8) {
      return false;
    }
    local_64 = *(undefined2 *)(this + 4);
    local_68 = *(undefined4 *)this;
    local_58[0] = 0;
    local_58[1] = 0;
    local_58[2] = 0;
    local_58[3] = 0;
    local_58[4] = 0;
    local_58[5] = 0;
    local_58[6] = 0;
    local_58[7] = 0;
    local_58[8] = 0;
    local_58[9] = 0;
    local_58[10] = 0;
    local_58[0xb] = 0;
    local_58[0xc] = 0;
    local_58[0xd] = 0;
    local_58[0xe] = 0;
    local_58[0xf] = 0;
    local_58[0x10] = 0;
    local_58[0x11] = 0;
    local_58[0x12] = 0;
    local_58[0x13] = 0;
    local_58[0x14] = 0;
    local_58[0x15] = 0;
    local_58[0x16] = 0;
    lVar4 = 0;
    do {
      psVar1 = (short *)((long)&local_68 + lVar4);
      if (*psVar1 != 0) break;
      bVar12 = lVar4 != 4;
      lVar4 = lVar4 + 2;
    } while (bVar12);
    if (*psVar1 != 0) {
      uVar6 = 0x17;
      do {
        lVar4 = 0;
        do {
          psVar1 = (short *)((long)&local_68 + lVar4);
          if (*psVar1 != 0) break;
          bVar12 = lVar4 != 4;
          lVar4 = lVar4 + 2;
        } while (bVar12);
        uVar7 = uVar6 - 1;
        if ((uVar6 == 0) || (*psVar1 == 0)) goto LAB_00147cdb;
        local_58[uVar7 & 0xffffffff] = (byte)local_68 & 7 | 0x30;
        lVar4 = 4;
        uVar8 = 0;
        do {
          uVar3 = *(ushort *)((long)&local_68 + lVar4);
          *(ushort *)((long)&local_68 + lVar4) = uVar8 | uVar3 >> 3;
          uVar8 = uVar3 << 0xd;
          lVar4 = lVar4 + -2;
          uVar6 = uVar7;
        } while (lVar4 != -2);
      } while( true );
    }
    local_58[0x16] = 0x30;
    uVar6 = 0x16;
LAB_00147cdb:
    if (show_base && 0 < (long)uVar6) {
      uVar6 = uVar6 - 1;
      local_58[uVar6 & 0xffffffff] = 0x30;
    }
    if (show_pos && 0 < (long)uVar6) {
      uVar6 = uVar6 - 1;
      local_58[uVar6 & 0xffffffff] = 0x2b;
    }
    if (field_width != 0) {
      lVar4 = 0;
      if (field_width < 0x18) {
        lVar4 = 0x17 - field_width;
      }
      while (lVar4 < (long)uVar6) {
        uVar6 = uVar6 - 1;
        local_58[uVar6 & 0xffffffff] = fill_char_str;
      }
    }
    local_58[0x17] = 0;
    lVar4 = 0;
    do {
      bVar2 = local_58[lVar4 + uVar6];
      str_result[lVar4] = bVar2;
      lVar4 = lVar4 + 1;
    } while (bVar2 != 0);
  }
  return true;
}

Assistant:

constexpr auto wr_string(      OutputStrIterator  str_result, // NOLINT(readability-function-cognitive-complexity)
                             const std::uint_fast8_t  base_rep      = static_cast<std::uint_fast8_t>(UINT8_C(0x10)),
                             const bool               show_base     = true,
                             const bool               show_pos      = false,
                             const bool               is_uppercase  = true,
                                   unsigned_fast_type field_width   = static_cast<unsigned_fast_type>(UINT8_C(0)),
                             const char               fill_char_str = '0') const -> bool
    {
      auto wr_string_is_ok = true;

      if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(8)))
      {
        uintwide_t<my_width2, limb_type, AllocatorType, false> t(*this);

        const auto mask = static_cast<limb_type>(static_cast<std::uint8_t>(0x7U));

        using string_storage_oct_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_oct()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_oct(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_oct_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_oct_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_oct_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '0';
        }
        else
        {
          while(!t.is_zero() && (pos > signed_fast_type { UINT8_C(0) })) // NOLINT(altera-id-dependent-backward-branch)
          {
            auto c = static_cast<char>(*t.values.cbegin() & mask);

            if(c <= static_cast<char>(INT8_C(8))) { c = static_cast<char>(c + static_cast<char>(INT8_C(0x30))); }

            str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = c;

            t >>= static_cast<unsigned>(UINT8_C(3));
          }
        }

        if(show_base && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '0';
        }

        if(show_pos && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '+';
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_oct_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(10)))
      {
        uintwide_t t(*this);

        const auto str_has_neg_sign = is_neg(t);

        if(str_has_neg_sign)
        {
          t.negate();
        }

        using string_storage_dec_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_dec()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_dec(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_dec_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_dec_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_dec_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '0';
        }
        else
        {
          while(!t.is_zero() && (pos > signed_fast_type { UINT8_C(0) }))
          {
            const uintwide_t tmp(t);

            t.eval_divide_by_single_limb(static_cast<limb_type>(UINT8_C(10)), 0U, nullptr);

            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] =
              static_cast<char>
              (
                  static_cast<limb_type>
                  (
                    tmp - (uintwide_t(t).mul_by_limb(static_cast<limb_type>(UINT8_C(10))))
                  )
                + static_cast<limb_type>(UINT8_C(0x30))
              );
          }
        }

        if(pos > signed_fast_type { UINT8_C(0) })
        {
          if(show_pos && (!str_has_neg_sign))
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '+';
          }
          else if(str_has_neg_sign)
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '-';
          }
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_dec_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(16)))
      {
        uintwide_t<my_width2, limb_type, AllocatorType, false> t(*this);

        using string_storage_hex_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_hex()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_hex(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_hex_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_hex_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_hex_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '0';
        }
        else
        {
          const auto dst =
            extract_hex_digits<false>
            (
              t,
              &str_temp[static_cast<typename string_storage_hex_type::size_type>(pos)],
              is_uppercase
            );

          pos -= static_cast<signed_fast_type>(dst);
        }

        if(show_base && (pos > signed_fast_type { UINT8_C(1) }))
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = (is_uppercase ? 'X' : 'x');

          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '0';
        }

        if(show_pos && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '+';
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_hex_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else
      {
        wr_string_is_ok = false;
      }

      return wr_string_is_ok;
    }